

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O2

bool CompressScript(CScript *script,CompressedScript *out)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  CompressedScript *pCVar5;
  uint uVar6;
  long in_FS_OFFSET;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  CPubKey local_99;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  CKeyID keyID;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  uVar1 = (script->super_CScriptBase)._size;
  uVar6 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar6 = uVar1;
  }
  if (uVar6 == 0x19) {
    if (0x1c < uVar1) {
      script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if (((((script->super_CScriptBase)._union.direct[0] == 'v') &&
         ((script->super_CScriptBase)._union.direct[1] == -0x57)) &&
        ((script->super_CScriptBase)._union.direct[2] == '\x14')) &&
       (((script->super_CScriptBase)._union.direct[0x17] == -0x78 &&
        ((script->super_CScriptBase)._union.direct[0x18] == -0x54)))) {
      keyID.super_uint160.super_base_blob<160U>.m_data._M_elems._16_4_ =
           *(undefined4 *)((long)&(script->super_CScriptBase)._union + 0x13);
      keyID.super_uint160.super_base_blob<160U>.m_data._M_elems._0_8_ =
           *(undefined8 *)((long)&(script->super_CScriptBase)._union.indirect_contents.indirect + 3)
      ;
      keyID.super_uint160.super_base_blob<160U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((long)&(script->super_CScriptBase)._union + 0xb);
      prevector<33U,_unsigned_char,_unsigned_int,_int>::resize(out,0x15);
      pCVar5 = out;
      if (0x21 < out->_size) {
        pCVar5 = (CompressedScript *)(out->_union).indirect_contents.indirect;
      }
      (pCVar5->_union).direct[0] = '\0';
      if (0x21 < out->_size) {
        out = (CompressedScript *)(out->_union).indirect_contents.indirect;
      }
      *(undefined4 *)((long)&out->_union + 0x11) =
           keyID.super_uint160.super_base_blob<160U>.m_data._M_elems._16_4_;
      uVar7 = keyID.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_;
      uVar8 = keyID.super_uint160.super_base_blob<160U>.m_data._M_elems._4_4_;
      uVar9 = keyID.super_uint160.super_base_blob<160U>.m_data._M_elems._8_4_;
      uVar10 = keyID.super_uint160.super_base_blob<160U>.m_data._M_elems._12_4_;
LAB_0057aeec:
      *(undefined4 *)((long)&out->_union + 1) = uVar7;
      *(undefined4 *)((long)&out->_union + 5) = uVar8;
      *(undefined4 *)((long)&(out->_union).indirect_contents.capacity + 1) = uVar9;
      *(undefined4 *)((long)&out->_union + 0xd) = uVar10;
LAB_0057aef0:
      bVar3 = true;
      goto LAB_0057afd9;
    }
  }
  else {
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    if (uVar6 == 0x17) {
      if (0x1c < uVar1) {
        script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      }
      if ((((script->super_CScriptBase)._union.direct[0] == -0x57) &&
          ((script->super_CScriptBase)._union.direct[1] == '\x14')) &&
         ((script->super_CScriptBase)._union.direct[0x16] == -0x79)) {
        local_48 = *(undefined4 *)((long)&(script->super_CScriptBase)._union + 0x12);
        local_58 = *(undefined8 *)((long)&(script->super_CScriptBase)._union + 2);
        uStack_50 = *(undefined8 *)((long)&(script->super_CScriptBase)._union + 10);
        prevector<33U,_unsigned_char,_unsigned_int,_int>::resize(out,0x15);
        pCVar5 = out;
        if (0x21 < out->_size) {
          pCVar5 = (CompressedScript *)(out->_union).indirect_contents.indirect;
        }
        (pCVar5->_union).direct[0] = '\x01';
        if (0x21 < out->_size) {
          out = (CompressedScript *)(out->_union).indirect_contents.indirect;
        }
        *(undefined4 *)((long)&out->_union + 0x11) = local_48;
        uVar7 = (undefined4)local_58;
        uVar8 = local_58._4_4_;
        uVar9 = (undefined4)uStack_50;
        uVar10 = uStack_50._4_4_;
        goto LAB_0057aeec;
      }
    }
    else {
      local_99.vch[0] = 0xff;
      if (uVar6 == 0x43) {
        if (0x1c < uVar1) {
          script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
        }
        if ((((script->super_CScriptBase)._union.direct[0] == 'A') &&
            (script[2].super_CScriptBase._union.direct[2] == -0x54)) &&
           ((script->super_CScriptBase)._union.direct[1] == '\x04')) {
          CPubKey::Set<unsigned_char_const*>
                    (&local_99,(uchar *)((script->super_CScriptBase)._union.direct + 1),
                     (uchar *)(script[2].super_CScriptBase._union.direct + 2));
          bVar3 = CPubKey::IsFullyValid(&local_99);
          if (bVar3) goto LAB_0057af82;
        }
      }
      else if (uVar6 == 0x23) {
        if (0x1c < uVar1) {
          script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
        }
        if ((((script->super_CScriptBase)._union.direct[0] == '!') &&
            (script[1].super_CScriptBase._union.direct[2] == -0x54)) &&
           (((script->super_CScriptBase)._union.direct[1] & 0xfeU) == 2)) {
          CPubKey::Set<unsigned_char_const*>
                    (&local_99,(uchar *)((script->super_CScriptBase)._union.direct + 1),
                     (uchar *)(script[1].super_CScriptBase._union.direct + 2));
LAB_0057af82:
          prevector<33U,_unsigned_char,_unsigned_int,_int>::resize(out,0x21);
          pCVar5 = out;
          if (0x21 < out->_size) {
            pCVar5 = (CompressedScript *)(out->_union).indirect_contents.indirect;
          }
          *(undefined8 *)((long)&pCVar5->_union + 0x11) = local_99.vch._17_8_;
          *(undefined8 *)((long)&pCVar5->_union + 0x19) = local_99.vch._25_8_;
          *(undefined8 *)((long)&(pCVar5->_union).indirect_contents.indirect + 1) =
               local_99.vch._1_8_;
          *(undefined8 *)((long)&pCVar5->_union + 9) = local_99.vch._9_8_;
          bVar4 = local_99.vch[0];
          if (1 < local_99.vch[0] - 2) {
            if (local_99.vch[0] != 4) goto LAB_0057afd7;
            bVar4 = local_99.vch[0x40] & 1 | 4;
          }
          if (0x21 < out->_size) {
            out = (CompressedScript *)(out->_union).indirect_contents.indirect;
          }
          (out->_union).direct[0] = bVar4;
          goto LAB_0057aef0;
        }
      }
    }
  }
LAB_0057afd7:
  bVar3 = false;
LAB_0057afd9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CompressScript(const CScript& script, CompressedScript& out)
{
    CKeyID keyID;
    if (IsToKeyID(script, keyID)) {
        out.resize(21);
        out[0] = 0x00;
        memcpy(&out[1], &keyID, 20);
        return true;
    }
    CScriptID scriptID;
    if (IsToScriptID(script, scriptID)) {
        out.resize(21);
        out[0] = 0x01;
        memcpy(&out[1], &scriptID, 20);
        return true;
    }
    CPubKey pubkey;
    if (IsToPubKey(script, pubkey)) {
        out.resize(33);
        memcpy(&out[1], &pubkey[1], 32);
        if (pubkey[0] == 0x02 || pubkey[0] == 0x03) {
            out[0] = pubkey[0];
            return true;
        } else if (pubkey[0] == 0x04) {
            out[0] = 0x04 | (pubkey[64] & 0x01);
            return true;
        }
    }
    return false;
}